

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBreakCommand.cxx
# Opt level: O3

bool cmBreakCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar6;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  bVar3 = cmMakefile::IsLoopBlock(status->Makefile);
  if (bVar3) {
LAB_0028e54d:
    status->BreakInvoked = true;
    bVar3 = true;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    MVar6 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0055,false);
    if (PVar4 - NEW < 3) {
      MVar6 = FATAL_ERROR;
      bVar2 = true;
LAB_0028e5fb:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"The BREAK command does not accept any arguments.",0x30);
      pcVar1 = status->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,MVar6,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) goto LAB_0028e653;
    }
    else if (PVar4 != OLD) {
      bVar2 = false;
      if (PVar4 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x37,id_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,
                            local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
        MVar6 = AUTHOR_WARNING;
      }
      goto LAB_0028e5fb;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    MVar6 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0055,false);
    if (2 < PVar4 - NEW) {
      if (PVar4 != OLD) {
        bVar3 = false;
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x37,id);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,
                              local_1c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = false;
          MVar6 = AUTHOR_WARNING;
        }
        goto LAB_0028e4d4;
      }
LAB_0028e52f:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
      goto LAB_0028e54d;
    }
    MVar6 = FATAL_ERROR;
    bVar3 = true;
LAB_0028e4d4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "A BREAK command was found outside of a proper FOREACH or WHILE loop scope.",0x4a);
    pcVar1 = status->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,MVar6,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) goto LAB_0028e52f;
LAB_0028e653:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmBreakCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (!status.GetMakefile().IsLoopBlock()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "A BREAK command was found outside of a proper "
           "FOREACH or WHILE loop scope.";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  status.SetBreakInvoked();

  if (!args.empty()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "The BREAK command does not accept any arguments.";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  return true;
}